

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O2

TWords * __thiscall
NJamSpell::TSpellCorrector::Edits(TWords *__return_storage_ptr__,TSpellCorrector *this,TWord *word)

{
  string *__return_storage_ptr___00;
  wstring *pwVar1;
  bool bVar2;
  undefined8 uVar3;
  wstring *word_00;
  initializer_list<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __l;
  undefined1 local_b8 [8];
  wstring w;
  string s;
  vector<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
  cands;
  undefined1 local_50 [8];
  TWord c;
  allocator_type local_31;
  
  local_b8 = (undefined1  [8])&w._M_string_length;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)local_b8,word->Ptr,word->Ptr + word->Len);
  (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetDeletes2((vector<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
               *)((long)&s.field_2 + 8),(wstring *)local_b8);
  std::__cxx11::wstring::wstring((wstring *)((long)&w.field_2 + 8),(wstring *)local_b8);
  __l._M_len = 1;
  __l._M_array = (iterator)((long)&w.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)local_50,__l,&local_31);
  std::
  vector<std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::allocator<std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>>>
  ::emplace_back<std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>>
            ((vector<std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::allocator<std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>>>
              *)(s.field_2._M_local_buf + 8),
             (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)local_50);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_50);
  __return_storage_ptr___00 = (string *)(&w.field_2._M_allocated_capacity + 1);
  std::__cxx11::wstring::~wstring((wstring *)__return_storage_ptr___00);
  for (uVar3 = s.field_2._8_8_;
      (pointer)uVar3 !=
      cands.
      super__Vector_base<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start; uVar3 = uVar3 + 0x18) {
    pwVar1 = (((pointer)uVar3)->
             super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (word_00 = (((pointer)uVar3)->
                   super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; word_00 != pwVar1;
        word_00 = word_00 + 1) {
      _local_50 = TLangModel::GetWord(&this->LangModel,word_00);
      if (local_50._8_8_ != 0 && local_50 != (wchar_t *)0x0) {
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                  (__return_storage_ptr__,(value_type *)local_50);
      }
      WideToUTF8(__return_storage_ptr___00,word_00);
      bVar2 = TBloomFilter::Contains
                        ((this->Deletes1)._M_t.
                         super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                         .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl,
                         __return_storage_ptr___00);
      if (bVar2) {
        Inserts(this,word_00,__return_storage_ptr__);
      }
      bVar2 = TBloomFilter::Contains
                        ((this->Deletes2)._M_t.
                         super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                         .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl,
                         __return_storage_ptr___00);
      if (bVar2) {
        Inserts2(this,word_00,__return_storage_ptr__);
      }
      std::__cxx11::string::~string((string *)__return_storage_ptr___00);
    }
  }
  std::
  vector<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
             *)((long)&s.field_2 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

TWords TSpellCorrector::Edits(const TWord& word) const {
    std::wstring w(word.Ptr, word.Len);
    TWords result;

    std::vector<std::vector<std::wstring>> cands = GetDeletes2(w);
    cands.push_back(std::vector<std::wstring>({w}));

    for (auto&& w1: cands) {
        for (auto&& w: w1) {
            TWord c = LangModel.GetWord(w);
            if (c.Ptr && c.Len) {
                result.push_back(c);
            }
            std::string s = WideToUTF8(w);
            if (Deletes1->Contains(s)) {
                Inserts(w, result);
            }
            if (Deletes2->Contains(s)) {
                Inserts2(w, result);
            }
        }
    }

    return result;
}